

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O0

string * __thiscall
cmRulePlaceholderExpander::ExpandRuleVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,
          cmOutputConverter *outputConverter,string *variable,RuleVariables *replaceValues)

{
  string *psVar1;
  bool bVar2;
  char *pcVar3;
  string *in_relative;
  mapped_type *pmVar4;
  ulong uVar5;
  long lVar6;
  pointer ppVar7;
  _Self local_368;
  _Self local_360;
  iterator mapIt;
  undefined1 local_338 [8];
  string sysroot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  mapped_type *local_2b8;
  string *compilerOptionSysroot;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  mapped_type *local_270;
  string *compilerOptionExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  mapped_type *local_228;
  string *compilerExternalToolchain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  mapped_type *local_1e0;
  string *compilerOptionTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  mapped_type *local_198;
  string *compilerTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  mapped_type *local_150;
  string *compilerArg1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  byte local_101;
  _Self local_100;
  _Self local_f8;
  iterator compIt;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  allocator<char> local_c8;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  allocator<char> local_c4;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  allocator<char> local_c0;
  allocator<char> local_bf;
  allocator<char> local_be;
  allocator<char> local_bd;
  undefined4 local_bc;
  long local_b8;
  size_type pos;
  string local_a8 [8];
  string targetBase;
  string local_80 [32];
  ulong local_60;
  size_type sz;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  RuleVariables *local_30;
  RuleVariables *replaceValues_local;
  string *variable_local;
  cmOutputConverter *outputConverter_local;
  cmRulePlaceholderExpander *this_local;
  string *targetQuoted;
  
  local_30 = replaceValues;
  replaceValues_local = (RuleVariables *)variable;
  variable_local = (string *)outputConverter;
  outputConverter_local = (cmOutputConverter *)this;
  this_local = (cmRulePlaceholderExpander *)__return_storage_ptr__;
  if ((replaceValues->LinkFlags == (char *)0x0) ||
     (bVar2 = std::operator==(variable,"LINK_FLAGS"), !bVar2)) {
    if ((local_30->Manifests == (char *)0x0) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )replaceValues_local,"MANIFESTS"), !bVar2)) {
      if ((local_30->Flags == (char *)0x0) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)replaceValues_local,"FLAGS"), !bVar2)) {
        if ((local_30->Source == (char *)0x0) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)replaceValues_local,"SOURCE"), !bVar2)) {
          if ((local_30->PreprocessedSource == (char *)0x0) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)replaceValues_local,"PREPROCESSED_SOURCE"), !bVar2)) {
            if ((local_30->AssemblySource == (char *)0x0) ||
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)replaceValues_local,"ASSEMBLY_SOURCE"), !bVar2)) {
              if ((local_30->Object == (char *)0x0) ||
                 (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)replaceValues_local,"OBJECT"), !bVar2)) {
                if ((local_30->ObjectDir == (char *)0x0) ||
                   (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)replaceValues_local,"OBJECT_DIR"), !bVar2)) {
                  if ((local_30->ObjectFileDir == (char *)0x0) ||
                     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)replaceValues_local,"OBJECT_FILE_DIR"), !bVar2)) {
                    if ((local_30->Objects == (char *)0x0) ||
                       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)replaceValues_local,"OBJECTS"), !bVar2)) {
                      if ((local_30->ObjectsQuoted == (char *)0x0) ||
                         (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"OBJECTS_QUOTED"), !bVar2))
                      {
                        if ((local_30->Defines == (char *)0x0) ||
                           (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"DEFINES"), !bVar2)) {
                          if ((local_30->Includes == (char *)0x0) ||
                             (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"INCLUDES"), !bVar2)) {
                            if ((local_30->TargetPDB == (char *)0x0) ||
                               (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_PDB"), !bVar2)) {
                              if ((local_30->TargetCompilePDB == (char *)0x0) ||
                                 (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_COMPILE_PDB"),
                                 !bVar2)) {
                                if ((local_30->DependencyFile == (char *)0x0) ||
                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"DEP_FILE"), !bVar2)) {
                                  if (local_30->Target != (char *)0x0) {
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_QUOTED");
                                    if (bVar2) {
                                      sz._4_1_ = 0;
                                      pcVar3 = local_30->Target;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,
                                                 (allocator<char> *)((long)&sz + 3));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)((long)&sz + 3));
                                      uVar5 = std::__cxx11::string::empty();
                                      if ((uVar5 & 1) != 0) {
                                        return __return_storage_ptr__;
                                      }
                                      pcVar3 = (char *)std::__cxx11::string::front();
                                      if (*pcVar3 == '\"') {
                                        return __return_storage_ptr__;
                                      }
                                      std::__cxx11::string::operator=
                                                ((string *)__return_storage_ptr__,'\"');
                                      std::__cxx11::string::operator+=
                                                ((string *)__return_storage_ptr__,local_30->Target);
                                      std::__cxx11::string::operator+=
                                                ((string *)__return_storage_ptr__,'\"');
                                      return __return_storage_ptr__;
                                    }
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_UNQUOTED");
                                    if (bVar2) {
                                      sz._2_1_ = 0;
                                      pcVar3 = local_30->Target;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,
                                                 (allocator<char> *)((long)&sz + 1));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)((long)&sz + 1));
                                      local_60 = std::__cxx11::string::size();
                                      if (local_60 < 3) {
                                        return __return_storage_ptr__;
                                      }
                                      pcVar3 = (char *)std::__cxx11::string::front();
                                      if (*pcVar3 != '\"') {
                                        return __return_storage_ptr__;
                                      }
                                      pcVar3 = (char *)std::__cxx11::string::back();
                                      if (*pcVar3 != '\"') {
                                        return __return_storage_ptr__;
                                      }
                                      std::__cxx11::string::substr
                                                ((ulong)local_80,(ulong)__return_storage_ptr__);
                                      std::__cxx11::string::operator=
                                                ((string *)__return_storage_ptr__,local_80);
                                      std::__cxx11::string::~string(local_80);
                                      return __return_storage_ptr__;
                                    }
                                    if ((local_30->LanguageCompileFlags != (char *)0x0) &&
                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LANGUAGE_COMPILE_FLAGS"),
                                       bVar2)) {
                                      pcVar3 = local_30->LanguageCompileFlags;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,
                                                 (allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xf));
                                      return __return_storage_ptr__;
                                    }
                                    if ((local_30->Target != (char *)0x0) &&
                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET"), bVar2)) {
                                      pcVar3 = local_30->Target;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,
                                                 (allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xe));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xe));
                                      return __return_storage_ptr__;
                                    }
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_IMPLIB");
                                    if (bVar2) {
                                      std::__cxx11::string::string
                                                ((string *)__return_storage_ptr__,(string *)this);
                                      return __return_storage_ptr__;
                                    }
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_VERSION_MAJOR");
                                    if (bVar2) {
                                      if (local_30->TargetVersionMajor != (char *)0x0) {
                                        pcVar3 = local_30->TargetVersionMajor;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)__return_storage_ptr__,pcVar3,
                                                   (allocator<char> *)
                                                   (targetBase.field_2._M_local_buf + 0xd));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   (targetBase.field_2._M_local_buf + 0xd));
                                        return __return_storage_ptr__;
                                      }
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,"0",
                                                 (allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xc));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 0xc));
                                      return __return_storage_ptr__;
                                    }
                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_VERSION_MINOR");
                                    if (bVar2) {
                                      if (local_30->TargetVersionMinor != (char *)0x0) {
                                        pcVar3 = local_30->TargetVersionMinor;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)__return_storage_ptr__,pcVar3,
                                                   (allocator<char> *)
                                                   (targetBase.field_2._M_local_buf + 0xb));
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)
                                                   (targetBase.field_2._M_local_buf + 0xb));
                                        return __return_storage_ptr__;
                                      }
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,"0",
                                                 (allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 10));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (targetBase.field_2._M_local_buf + 10));
                                      return __return_storage_ptr__;
                                    }
                                    if ((local_30->Target != (char *)0x0) &&
                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_BASE"), bVar2)) {
                                      pcVar3 = local_30->Target;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                (local_a8,pcVar3,(allocator<char> *)((long)&pos + 7)
                                                );
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)((long)&pos + 7));
                                      local_b8 = std::__cxx11::string::rfind((char)local_a8,0x2e);
                                      if (local_b8 == -1) {
                                        std::__cxx11::string::string
                                                  ((string *)__return_storage_ptr__,local_a8);
                                      }
                                      else {
                                        std::__cxx11::string::substr
                                                  ((ulong)__return_storage_ptr__,(ulong)local_a8);
                                      }
                                      local_bc = 1;
                                      std::__cxx11::string::~string(local_a8);
                                      return __return_storage_ptr__;
                                    }
                                  }
                                  if ((local_30->SwiftAuxiliarySources == (char *)0x0) ||
                                     (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_AUXILIARY_SOURCES"),
                                     !bVar2)) {
                                    if ((local_30->SwiftModuleName == (char *)0x0) ||
                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_MODULE_NAME"), !bVar2
                                       )) {
                                      if ((local_30->SwiftLibraryName == (char *)0x0) ||
                                         (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_LIBRARY_NAME"),
                                         !bVar2)) {
                                        if ((local_30->SwiftPartialDoc == (char *)0x0) ||
                                           (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_PARTIAL_DOC"), !bVar2
                                           )) {
                                          if ((local_30->SwiftPartialModule == (char *)0x0) ||
                                             (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_PARTIAL_MODULE"),
                                             !bVar2)) {
                                            if ((local_30->SwiftPartialModules == (char *)0x0) ||
                                               (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SWIFT_PARTIAL_MODULES"),
                                               !bVar2)) {
                                              if ((local_30->TargetSwiftDoc == (char *)0x0) ||
                                                 (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SWIFT_DOC"), !bVar2)
                                                 ) {
                                                if ((local_30->TargetSwiftModule == (char *)0x0) ||
                                                   (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SWIFT_MODULE"),
                                                  !bVar2)) {
                                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SONAME");
                                                  if (((bVar2) ||
                                                      (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SONAME_FLAG"), bVar2)) ||
                                                  (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_INSTALLNAME_DIR"),
                                                  bVar2)) {
                                                    if (local_30->TargetSOName != (char *)0x0) {
                                                      bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_SONAME");
                                                  if (bVar2) {
                                                    pcVar3 = local_30->TargetSOName;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c5);
                                                    std::allocator<char>::~allocator(&local_c5);
                                                    return __return_storage_ptr__;
                                                  }
                                                  bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"SONAME_FLAG");
                                                  if ((bVar2) &&
                                                     (local_30->SONameFlag != (char *)0x0)) {
                                                    pcVar3 = local_30->SONameFlag;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c6);
                                                    std::allocator<char>::~allocator(&local_c6);
                                                    return __return_storage_ptr__;
                                                  }
                                                  if ((local_30->TargetInstallNameDir != (char *)0x0
                                                      ) && (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_INSTALLNAME_DIR"),
                                                  bVar2)) {
                                                    pcVar3 = local_30->TargetInstallNameDir;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c7);
                                                    std::allocator<char>::~allocator(&local_c7);
                                                    return __return_storage_ptr__;
                                                  }
                                                  }
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)__return_storage_ptr__,"",
                                                             &local_c8);
                                                  std::allocator<char>::~allocator(&local_c8);
                                                  }
                                                  else if ((local_30->LinkLibraries == (char *)0x0)
                                                          || (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LINK_LIBRARIES"), !bVar2))
                                                  {
                                                    if ((local_30->Language == (char *)0x0) ||
                                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"LANGUAGE"), !bVar2)) {
                                                    if ((local_30->CMTargetName == (char *)0x0) ||
                                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_NAME"), !bVar2)) {
                                                    if ((local_30->CMTargetType == (char *)0x0) ||
                                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"TARGET_TYPE"), !bVar2)) {
                                                    if ((local_30->Output == (char *)0x0) ||
                                                       (bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"OUTPUT"), !bVar2)) {
                                                    bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)replaceValues_local,"CMAKE_COMMAND");
                                                  psVar1 = variable_local;
                                                  if (bVar2) {
                                                    in_relative = cmSystemTools::
                                                                  GetCMakeCommand_abi_cxx11_();
                                                    cmsys::SystemTools::CollapseFullPath
                                                              ((string *)&compIt,in_relative);
                                                    cmOutputConverter::ConvertToOutputFormat
                                                              (__return_storage_ptr__,
                                                               (cmOutputConverter *)psVar1,
                                                               (string *)&compIt,SHELL);
                                                    std::__cxx11::string::~string((string *)&compIt)
                                                    ;
                                                  }
                                                  else {
                                                    local_f8._M_node =
                                                         (_Base_ptr)
                                                         std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&this->Compilers,
                                                         (key_type *)replaceValues_local);
                                                  local_100._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(&this->Compilers);
                                                  bVar2 = std::operator!=(&local_f8,&local_100);
                                                  psVar1 = variable_local;
                                                  if (bVar2) {
                                                    local_101 = 0;
                                                    ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerArg1,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_128,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerArg1,"_COMPILER");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_128);
                                                  cmOutputConverter::ConvertToOutputForExisting
                                                            (__return_storage_ptr__,
                                                             (cmOutputConverter *)psVar1,pmVar4,
                                                             SHELL);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_128);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerArg1);
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerTarget,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_170,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerTarget,"_COMPILER_ARG1");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_170);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_170);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerTarget);
                                                  local_150 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionTarget,"CMAKE_",&ppVar7->second);
                                                  std::operator+(&local_1b8,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionTarget,"_COMPILER_TARGET");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_1b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerOptionTarget);
                                                  local_198 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerExternalToolchain,"CMAKE_",
                                                  &ppVar7->second);
                                                  std::operator+(&local_200,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerExternalToolchain,
                                                  "_COMPILE_OPTIONS_TARGET");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_200);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_200);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerExternalToolchain);
                                                  local_1e0 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionExternalToolchain,"CMAKE_",
                                                  &ppVar7->second);
                                                  std::operator+(&local_248,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionExternalToolchain,
                                                  "_COMPILER_EXTERNAL_TOOLCHAIN");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_248);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_248);
                                                  std::__cxx11::string::~string
                                                            ((string *)
                                                             &compilerOptionExternalToolchain);
                                                  local_228 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionSysroot,"CMAKE_",&ppVar7->second)
                                                  ;
                                                  std::operator+(&local_290,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&compilerOptionSysroot,
                                                  "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_290);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_290);
                                                  std::__cxx11::string::~string
                                                            ((string *)&compilerOptionSysroot);
                                                  local_270 = pmVar4;
                                                  ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_f8);
                                                  std::operator+(&local_2f8,"CMAKE_",&ppVar7->second
                                                                );
                                                  std::operator+(&local_2d8,&local_2f8,
                                                                 "_COMPILE_OPTIONS_SYSROOT");
                                                  pmVar4 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](&this->VariableMappings,&local_2d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_2f8);
                                                  local_2b8 = pmVar4;
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if ((uVar5 & 1) == 0) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_150);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_1e0);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_198);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_270);
                                                    cmOutputConverter::EscapeForShell
                                                              ((string *)
                                                               ((long)&sysroot.field_2 + 8),
                                                               (cmOutputConverter *)variable_local,
                                                               local_228,true,false,false);
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)
                                                               (sysroot.field_2._M_local_buf + 8));
                                                    std::__cxx11::string::~string
                                                              ((string *)
                                                               (sysroot.field_2._M_local_buf + 8));
                                                  }
                                                  std::__cxx11::string::string((string *)local_338);
                                                  if (local_30->LinkFlags == (char *)0x0) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_338,
                                                               (string *)&this->CompilerSysroot);
                                                  }
                                                  else {
                                                    std::__cxx11::string::operator=
                                                              ((string *)local_338,
                                                               (string *)&this->LinkerSysroot);
                                                  }
                                                  uVar5 = std::__cxx11::string::empty();
                                                  if (((uVar5 & 1) == 0) &&
                                                     (uVar5 = std::__cxx11::string::empty(),
                                                     (uVar5 & 1) == 0)) {
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__," ")
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)local_2b8);
                                                    cmOutputConverter::EscapeForShell
                                                              ((string *)&mapIt,
                                                               (cmOutputConverter *)variable_local,
                                                               (string *)local_338,true,false,false)
                                                    ;
                                                    std::__cxx11::string::operator+=
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)&mapIt);
                                                    std::__cxx11::string::~string((string *)&mapIt);
                                                  }
                                                  local_101 = 1;
                                                  local_bc = 1;
                                                  std::__cxx11::string::~string((string *)local_338)
                                                  ;
                                                  if ((local_101 & 1) == 0) {
                                                    std::__cxx11::string::~string
                                                              ((string *)__return_storage_ptr__);
                                                  }
                                                  }
                                                  else {
                                                    local_360._M_node =
                                                         (_Base_ptr)
                                                         std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&this->VariableMappings,
                                                         (key_type *)replaceValues_local);
                                                  local_368._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(&this->VariableMappings);
                                                  bVar2 = std::operator!=(&local_360,&local_368);
                                                  if (bVar2) {
                                                    lVar6 = std::__cxx11::string::find
                                                                      ((char *)replaceValues_local,
                                                                       0x8784a1);
                                                    psVar1 = variable_local;
                                                    if (lVar6 == -1) {
                                                      ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_360);
                                                  cmOutputConverter::ConvertToOutputForExisting
                                                            (__return_storage_ptr__,
                                                             (cmOutputConverter *)psVar1,
                                                             &ppVar7->second,SHELL);
                                                  }
                                                  else {
                                                    ppVar7 = std::
                                                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_360);
                                                  std::__cxx11::string::string
                                                            ((string *)__return_storage_ptr__,
                                                             (string *)&ppVar7->second);
                                                  }
                                                  }
                                                  else {
                                                    std::__cxx11::string::string
                                                              ((string *)__return_storage_ptr__,
                                                               (string *)replaceValues_local);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = local_30->Output;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_cd);
                                                    std::allocator<char>::~allocator(&local_cd);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = local_30->CMTargetType;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_cc);
                                                    std::allocator<char>::~allocator(&local_cc);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = local_30->CMTargetName;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_cb);
                                                    std::allocator<char>::~allocator(&local_cb);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = local_30->Language;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_ca);
                                                    std::allocator<char>::~allocator(&local_ca);
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = local_30->LinkLibraries;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)__return_storage_ptr__,
                                                               pcVar3,&local_c9);
                                                    std::allocator<char>::~allocator(&local_c9);
                                                  }
                                                }
                                                else {
                                                  pcVar3 = local_30->TargetSwiftModule;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)__return_storage_ptr__,pcVar3
                                                             ,&local_c4);
                                                  std::allocator<char>::~allocator(&local_c4);
                                                }
                                              }
                                              else {
                                                pcVar3 = local_30->TargetSwiftDoc;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)__return_storage_ptr__,pcVar3,
                                                           &local_c3);
                                                std::allocator<char>::~allocator(&local_c3);
                                              }
                                            }
                                            else {
                                              pcVar3 = local_30->SwiftPartialModules;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)__return_storage_ptr__,pcVar3,
                                                         &local_c2);
                                              std::allocator<char>::~allocator(&local_c2);
                                            }
                                          }
                                          else {
                                            pcVar3 = local_30->SwiftPartialModule;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)__return_storage_ptr__,pcVar3,
                                                       &local_c1);
                                            std::allocator<char>::~allocator(&local_c1);
                                          }
                                        }
                                        else {
                                          pcVar3 = local_30->SwiftPartialDoc;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)__return_storage_ptr__,pcVar3,
                                                     &local_c0);
                                          std::allocator<char>::~allocator(&local_c0);
                                        }
                                      }
                                      else {
                                        pcVar3 = local_30->SwiftLibraryName;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)__return_storage_ptr__,pcVar3,&local_bf
                                                  );
                                        std::allocator<char>::~allocator(&local_bf);
                                      }
                                    }
                                    else {
                                      pcVar3 = local_30->SwiftModuleName;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)__return_storage_ptr__,pcVar3,&local_be);
                                      std::allocator<char>::~allocator(&local_be);
                                    }
                                  }
                                  else {
                                    pcVar3 = local_30->SwiftAuxiliarySources;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)__return_storage_ptr__,pcVar3,&local_bd);
                                    std::allocator<char>::~allocator(&local_bd);
                                  }
                                }
                                else {
                                  pcVar3 = local_30->DependencyFile;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)__return_storage_ptr__,pcVar3,
                                             (allocator<char> *)((long)&sz + 5));
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)((long)&sz + 5));
                                }
                              }
                              else {
                                pcVar3 = local_30->TargetCompilePDB;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)__return_storage_ptr__,pcVar3,
                                           (allocator<char> *)((long)&sz + 6));
                                std::allocator<char>::~allocator((allocator<char> *)((long)&sz + 6))
                                ;
                              }
                            }
                            else {
                              pcVar3 = local_30->TargetPDB;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)__return_storage_ptr__,pcVar3,
                                         (allocator<char> *)((long)&sz + 7));
                              std::allocator<char>::~allocator((allocator<char> *)((long)&sz + 7));
                            }
                          }
                          else {
                            pcVar3 = local_30->Includes;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,pcVar3,&local_50);
                            std::allocator<char>::~allocator(&local_50);
                          }
                        }
                        else {
                          pcVar3 = local_30->Defines;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)__return_storage_ptr__,pcVar3,&local_4f);
                          std::allocator<char>::~allocator(&local_4f);
                        }
                      }
                      else {
                        pcVar3 = local_30->ObjectsQuoted;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)__return_storage_ptr__,pcVar3,&local_4e);
                        std::allocator<char>::~allocator(&local_4e);
                      }
                    }
                    else {
                      pcVar3 = local_30->Objects;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)__return_storage_ptr__,pcVar3,&local_4d);
                      std::allocator<char>::~allocator(&local_4d);
                    }
                  }
                  else {
                    pcVar3 = local_30->ObjectFileDir;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)__return_storage_ptr__,pcVar3,&local_4c);
                    std::allocator<char>::~allocator(&local_4c);
                  }
                }
                else {
                  pcVar3 = local_30->ObjectDir;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)__return_storage_ptr__,pcVar3,&local_4b);
                  std::allocator<char>::~allocator(&local_4b);
                }
              }
              else {
                pcVar3 = local_30->Object;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,pcVar3,&local_4a);
                std::allocator<char>::~allocator(&local_4a);
              }
            }
            else {
              pcVar3 = local_30->AssemblySource;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,pcVar3,&local_49);
              std::allocator<char>::~allocator(&local_49);
            }
          }
          else {
            pcVar3 = local_30->PreprocessedSource;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,pcVar3,&local_48);
            std::allocator<char>::~allocator(&local_48);
          }
        }
        else {
          pcVar3 = local_30->Source;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,pcVar3,&local_47);
          std::allocator<char>::~allocator(&local_47);
        }
      }
      else {
        pcVar3 = local_30->Flags;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar3,&local_46);
        std::allocator<char>::~allocator(&local_46);
      }
    }
    else {
      pcVar3 = local_30->Manifests;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar3,local_45);
      std::allocator<char>::~allocator(local_45);
    }
  }
  else {
    pcVar3 = local_30->LinkFlags;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandRuleVariable(
  cmOutputConverter* outputConverter, std::string const& variable,
  const RuleVariables& replaceValues)
{
  if (replaceValues.LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return replaceValues.LinkFlags;
    }
  }
  if (replaceValues.Manifests) {
    if (variable == "MANIFESTS") {
      return replaceValues.Manifests;
    }
  }
  if (replaceValues.Flags) {
    if (variable == "FLAGS") {
      return replaceValues.Flags;
    }
  }

  if (replaceValues.Source) {
    if (variable == "SOURCE") {
      return replaceValues.Source;
    }
  }
  if (replaceValues.PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return replaceValues.PreprocessedSource;
    }
  }
  if (replaceValues.AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return replaceValues.AssemblySource;
    }
  }
  if (replaceValues.Object) {
    if (variable == "OBJECT") {
      return replaceValues.Object;
    }
  }
  if (replaceValues.ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return replaceValues.ObjectDir;
    }
  }
  if (replaceValues.ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return replaceValues.ObjectFileDir;
    }
  }
  if (replaceValues.Objects) {
    if (variable == "OBJECTS") {
      return replaceValues.Objects;
    }
  }
  if (replaceValues.ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return replaceValues.ObjectsQuoted;
    }
  }
  if (replaceValues.Defines && variable == "DEFINES") {
    return replaceValues.Defines;
  }
  if (replaceValues.Includes && variable == "INCLUDES") {
    return replaceValues.Includes;
  }
  if (replaceValues.TargetPDB) {
    if (variable == "TARGET_PDB") {
      return replaceValues.TargetPDB;
    }
  }
  if (replaceValues.TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return replaceValues.TargetCompilePDB;
    }
  }
  if (replaceValues.DependencyFile) {
    if (variable == "DEP_FILE") {
      return replaceValues.DependencyFile;
    }
  }

  if (replaceValues.Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = replaceValues.Target;
      if (!targetQuoted.empty() && targetQuoted.front() != '\"') {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted.front() == '\"' && unquoted.back() == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (replaceValues.LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return replaceValues.LanguageCompileFlags;
      }
    }
    if (replaceValues.Target) {
      if (variable == "TARGET") {
        return replaceValues.Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (replaceValues.TargetVersionMajor) {
        return replaceValues.TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (replaceValues.TargetVersionMinor) {
        return replaceValues.TargetVersionMinor;
      }
      return "0";
    }
    if (replaceValues.Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (replaceValues.SwiftAuxiliarySources) {
    if (variable == "SWIFT_AUXILIARY_SOURCES") {
      return replaceValues.SwiftAuxiliarySources;
    }
  }
  if (replaceValues.SwiftModuleName) {
    if (variable == "SWIFT_MODULE_NAME") {
      return replaceValues.SwiftModuleName;
    }
  }
  if (replaceValues.SwiftLibraryName) {
    if (variable == "SWIFT_LIBRARY_NAME") {
      return replaceValues.SwiftLibraryName;
    }
  }
  if (replaceValues.SwiftPartialDoc) {
    if (variable == "SWIFT_PARTIAL_DOC") {
      return replaceValues.SwiftPartialDoc;
    }
  }
  if (replaceValues.SwiftPartialModule) {
    if (variable == "SWIFT_PARTIAL_MODULE") {
      return replaceValues.SwiftPartialModule;
    }
  }
  if (replaceValues.SwiftPartialModules) {
    if (variable == "SWIFT_PARTIAL_MODULES") {
      return replaceValues.SwiftPartialModules;
    }
  }
  if (replaceValues.TargetSwiftDoc) {
    if (variable == "TARGET_SWIFT_DOC") {
      return replaceValues.TargetSwiftDoc;
    }
  }
  if (replaceValues.TargetSwiftModule) {
    if (variable == "TARGET_SWIFT_MODULE") {
      return replaceValues.TargetSwiftModule;
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (replaceValues.TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return replaceValues.TargetSOName;
      }
      if (variable == "SONAME_FLAG" && replaceValues.SONameFlag) {
        return replaceValues.SONameFlag;
      }
      if (replaceValues.TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return replaceValues.TargetInstallNameDir;
      }
    }
    return "";
  }
  if (replaceValues.LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return replaceValues.LinkLibraries;
    }
  }
  if (replaceValues.Language) {
    if (variable == "LANGUAGE") {
      return replaceValues.Language;
    }
  }
  if (replaceValues.CMTargetName) {
    if (variable == "TARGET_NAME") {
      return replaceValues.CMTargetName;
    }
  }
  if (replaceValues.CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return replaceValues.CMTargetType;
    }
  }
  if (replaceValues.Output) {
    if (variable == "OUTPUT") {
      return replaceValues.Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return outputConverter->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  std::map<std::string, std::string>::iterator compIt =
    this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = outputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    // if there is a required first argument to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret += outputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (replaceValues.LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += outputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  std::map<std::string, std::string>::iterator mapIt =
    this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      return outputConverter->ConvertToOutputForExisting(mapIt->second);
    }
    return mapIt->second;
  }
  return variable;
}